

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::addOrChangeBinding
          (InScopeNamespaces *this,XMLCh *prefix,XMLCh *uri,MemoryManager *manager)

{
  XMLSize_t XVar1;
  Scope *this_00;
  
  XVar1 = (this->fScopes->
          super_BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>).fCurCount;
  if (XVar1 == 0) {
    addScope(this,manager);
  }
  this_00 = BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>::elementAt
                      (&this->fScopes->
                        super_BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>,
                       XVar1 - 1);
  Scope::addOrChangeBinding(this_00,prefix,uri,manager);
  this->lastScopeWithBindings = this_00;
  return;
}

Assistant:

void DOMNormalizer::InScopeNamespaces::addOrChangeBinding(const XMLCh *prefix, const XMLCh *uri,
                                                          MemoryManager* const manager) {
    XMLSize_t s = fScopes->size();

    if(!s)
        addScope(manager);

    Scope *curScope = fScopes->elementAt(s - 1);
    curScope->addOrChangeBinding(prefix, uri, manager);

    lastScopeWithBindings = curScope;
}